

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bison.cpp
# Opt level: O0

void yydestruct(char *yymsg,yysymbol_kind_t yykind,YYSTYPE *yyvaluep,YYLTYPE *yylocationp,
               CProgram **program)

{
  CProgram **program_local;
  YYLTYPE *yylocationp_local;
  YYSTYPE *yyvaluep_local;
  yysymbol_kind_t yykind_local;
  char *yymsg_local;
  
  return;
}

Assistant:

static void
yydestruct (const char *yymsg,
            yysymbol_kind_t yykind, YYSTYPE *yyvaluep, YYLTYPE *yylocationp, CProgram** program)
{
  YY_USE (yyvaluep);
  YY_USE (yylocationp);
  YY_USE (program);
  if (!yymsg)
    yymsg = "Deleting";
  YY_SYMBOL_PRINT (yymsg, yykind, yyvaluep, yylocationp);

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  YY_USE (yykind);
  YY_IGNORE_MAYBE_UNINITIALIZED_END
}